

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queries.c
# Opt level: O0

vec3_t project_to_plane(plane_t p,vec3_t pt)

{
  ray3_t r;
  plane_t p_00;
  vec3_t vVar1;
  undefined1 auStack_b0 [8];
  ray3_t ray;
  vec3_t invN;
  vec3_t pt_local;
  plane_t p_local;
  vec3_t out;
  
  p_local._0_8_ = p._8_8_;
  vVar1 = plane_normal(p);
  join_0x00001240_0x00001200_ = vec3_mulf(vVar1,-1.0);
  ray3_from((ray3_t *)auStack_b0,pt,join_0x00001240_0x00001200_);
  p_00.c = p_local.a;
  p_00.d = p_local.b;
  p_00.a = (float)(int)p._0_8_;
  p_00.b = (float)(int)((ulong)p._0_8_ >> 0x20);
  r.start.z = ray.start.x;
  r.direction.x = ray.start.y;
  r.start.x = (float)auStack_b0._0_4_;
  r.start.y = (float)auStack_b0._4_4_;
  r.direction.y = ray.start.z;
  r.direction.z = ray.direction.x;
  p_local._8_8_ = pt._0_8_;
  plane_ray3_intersection(p_00,r,(vec3_t *)&p_local.c);
  vVar1.z = pt.z;
  vVar1.x = p_local.c;
  vVar1.y = p_local.d;
  return vVar1;
}

Assistant:

vec3_t
project_to_plane(plane_t p, vec3_t pt) {
    vec3_t  invN    = vec3_mulf(plane_normal(p), -1.0f);
    ray3_t  ray     = ray3_from(pt, invN);
    vec3_t  out     = pt;
    plane_ray3_intersection(p, ray, &out);
    return out;
}